

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_test.c
# Opt level: O0

void * yajlTestRealloc(void *ctx,void *ptr,size_t sz)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  int *in_RDI;
  
  if (in_RSI == (void *)0x0) {
    in_RDI[1] = in_RDI[1] + 1;
  }
  else if (in_RDX == 0) {
    *in_RDI = *in_RDI + 1;
  }
  pvVar1 = realloc(in_RSI,in_RDX);
  return pvVar1;
}

Assistant:

static void * yajlTestRealloc(void * ctx, void * ptr, size_t sz)
{
    if (ptr == NULL) {
        assert(sz != 0);
        TEST_CTX(ctx)->numMallocs++;
    } else if (sz == 0) {
        TEST_CTX(ctx)->numFrees++;
    }

    return realloc(ptr, sz);
}